

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::asFile
          (InMemoryDirectory *this,Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,
          EntryImpl *entry,WriteMode mode)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  FileNode *pFVar4;
  int iVar5;
  undefined4 in_register_0000000c;
  long lVar6;
  File *extraout_RDX;
  void *__child_stack;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *pFVar7;
  Array<kj::String> *this_00;
  void *in_R8;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  *this_01;
  Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> MVar8;
  PathPtr path;
  Path newPath;
  DebugExpression<bool> _kjCondition;
  Array<kj::String> local_58;
  Own<const_kj::File,_std::nullptr_t> local_38;
  
  lVar6 = CONCAT44(in_register_0000000c,mode);
  iVar5 = *(int *)(lVar6 + 0x18);
  if (iVar5 == 0) {
    local_38.disposer._0_1_ = (byte)in_R8 & 1;
    if (((ulong)in_R8 & 1) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x6b6,FAILED,"has(mode, WriteMode::CREATE)","_kjCondition,",
                 (DebugExpression<bool> *)&local_38);
      kj::_::Debug::Fault::fatal((Fault *)&local_58);
    }
    this_01 = (OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
               *)(lVar6 + 0x18);
    puVar1 = (undefined8 *)(entry->name).content.size_;
    uVar3 = (*(code *)**(undefined8 **)*puVar1)();
    iVar5 = (int)lVar6;
    puVar1[8] = uVar3;
    puVar1 = (undefined8 *)(entry->name).content.size_;
    puVar2 = (undefined8 *)puVar1[1];
    (**(code **)*puVar2)(&local_38,puVar2,*puVar1);
    pFVar4 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
             ::
             init<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::FileNode>
                       (this_01,(FileNode *)&local_38);
    File::clone((File *)&local_58,(__fn *)(pFVar4->file).ptr,__child_stack,iVar5,in_R8);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)local_58.ptr;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_58.size_;
    local_58.size_ = 0;
    Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&local_58);
    this_00 = (Array<kj::String> *)&local_38;
  }
  else {
    if (iVar5 == 3) {
      SymlinkNode::parse((Path *)&local_58,(SymlinkNode *)(lVar6 + 0x20));
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry);
      path.parts.size_ = (size_t)local_58.ptr;
      path.parts.ptr = (String *)lock;
      tryOpenFile(this,path,(WriteMode)local_58.size_);
      Array<kj::String>::~Array(&local_58);
      pFVar7 = extraout_RDX;
      goto LAB_003b8261;
    }
    if (iVar5 != 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                ((Fault *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x6ba,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      kj::_::Debug::Fault::~Fault((Fault *)&local_58);
      pFVar7 = extraout_RDX_01;
      goto LAB_003b8261;
    }
    this_00 = &local_58;
    File::clone((File *)this_00,*(__fn **)(lVar6 + 0x28),entry,mode,in_R8);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)local_58.ptr;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_58.size_;
    local_58.size_ = 0;
  }
  Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)this_00);
  pFVar7 = extraout_RDX_00;
LAB_003b8261:
  MVar8.ptr.ptr = pFVar7;
  MVar8.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>)MVar8.ptr;
}

Assistant:

Maybe<Own<const File>> asFile(kj::Locked<Impl>& lock, EntryImpl& entry, WriteMode mode) const {
    if (entry.node.is<FileNode>()) {
      return entry.node.get<FileNode>().file->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      // CREATE_PARENT doesn't apply to creating the parents of a symlink target. However, the
      // target itself can still be created.
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenFile(newPath, mode - WriteMode::CREATE_PARENT);
    } else if (entry.node == nullptr) {
      KJ_ASSERT(has(mode, WriteMode::CREATE));
      lock->modified();
      return entry.init(FileNode { lock->newFile() });
    } else {
      KJ_FAIL_REQUIRE("not a file") { return kj::none; }
    }
  }